

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k051649.c
# Opt level: O0

void device_reset_k051649(void *chip)

{
  int local_24;
  int i;
  k051649_sound_channel *voice;
  k051649_state *info;
  void *chip_local;
  
  for (local_24 = 0; local_24 < 5; local_24 = local_24 + 1) {
    *(undefined4 *)((long)chip + (long)local_24 * 0x2c + 0xc) = 0;
    *(undefined1 *)((long)chip + (long)local_24 * 0x2c + 0x10) = 0;
    *(undefined4 *)((long)chip + (long)local_24 * 0x2c + 8) = 0;
    *(undefined1 *)((long)chip + (long)local_24 * 0x2c + 0x11) = 0;
  }
  *(undefined1 *)((long)chip + 0x100) = 0;
  *(undefined1 *)((long)chip + 0x101) = 0;
  return;
}

Assistant:

static void device_reset_k051649(void *chip)
{
	k051649_state *info = (k051649_state *)chip;
	k051649_sound_channel *voice = info->channel_list;
	int i;

	// reset all the voices
	for (i = 0; i < 5; i++)
	{
		voice[i].frequency = 0;
		voice[i].volume = 0;
		voice[i].counter = 0;
		voice[i].key = 0;
	}
	
	// other parameters
	info->test = 0x00;
	info->cur_reg = 0x00;
	
	return;
}